

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_get(t_list_store *x,float f1,float f2)

{
  _outlet *p_Var1;
  t_atom *to;
  int iVar2;
  int onset_00;
  t_atom *ptVar3;
  long lVar4;
  t_atom tStack_58;
  t_atom *local_48;
  undefined1 local_40 [8];
  t_alist y;
  int outc;
  int onset;
  t_atom *outv;
  float f2_local;
  float f1_local;
  t_list_store *x_local;
  
  ptVar3 = &tStack_58;
  y.l_vec._4_4_ = (int)f1;
  y.l_vec._0_4_ = (int)f2;
  if ((int)y.l_vec == 0) {
    y.l_vec._0_4_ = 1;
  }
  else if (((int)y.l_vec < 0) &&
          (y.l_vec._0_4_ = (x->x_alist).l_n - y.l_vec._4_4_, (int)y.l_vec < 1)) {
    outlet_bang(x->x_out2);
    return;
  }
  if ((y.l_vec._4_4_ < 0) || ((x->x_alist).l_n < y.l_vec._4_4_ + (int)y.l_vec)) {
    outlet_bang(x->x_out2);
  }
  else {
    if ((int)y.l_vec < 100) {
      ptVar3 = &tStack_58 + -(long)(int)y.l_vec;
      local_48 = ptVar3;
    }
    else {
      local_48 = (t_atom *)getbytes((long)(int)y.l_vec << 4);
    }
    onset_00 = y.l_vec._4_4_;
    iVar2 = (int)y.l_vec;
    to = local_48;
    if ((x->x_alist).l_npointer == 0) {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c5341;
      alist_toatoms(&x->x_alist,to,onset_00,iVar2);
      iVar2 = (int)y.l_vec;
      p_Var1 = x->x_out1;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c535c;
      outlet_list(p_Var1,&s_list,iVar2,to);
    }
    else {
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c52f2;
      alist_clone(&x->x_alist,(t_alist *)local_40,onset_00,iVar2);
      iVar2 = (int)y.l_vec;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c5304;
      alist_toatoms((t_alist *)local_40,to,0,iVar2);
      iVar2 = (int)y.l_vec;
      p_Var1 = x->x_out1;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c531f;
      outlet_list(p_Var1,&s_list,iVar2,to);
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c5328;
      alist_clear((t_alist *)local_40);
    }
    tStack_58.a_w._7_1_ = 1;
    if (99 < (int)y.l_vec) {
      lVar4 = (long)(int)y.l_vec;
      ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c5378;
      freebytes(to,lVar4 << 4);
    }
  }
  return;
}

Assistant:

static void list_store_get(t_list_store *x, float f1, float f2)
{
    t_atom *outv;
    int onset = f1, outc = f2;
    if (!outc)
        outc = 1; /* default */
    else if (outc < 0)
    {
        outc = x->x_alist.l_n - onset; /* till the end of the list */
        if (outc <= 0) /* onset out of range */
        {
            outlet_bang(x->x_out2);
            return;
        }
    }
    if (onset < 0 || (onset + outc > x->x_alist.l_n))
    {
        outlet_bang(x->x_out2);
        return;
    }
    ATOMS_ALLOCA(outv, outc);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, onset, outc);
        alist_toatoms(&y, outv, 0, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv, onset, outc);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}